

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

void Saig_ManDemiterMarkPos(Aig_Man_t *p)

{
  Vec_Ptr_t *p_00;
  ulong uVar1;
  int iVar2;
  void *pvVar3;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar4;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  Aig_ManCleanMarkAB(p);
  for (local_1c = 0; iVar2 = Saig_ManRegNum(p), local_1c < iVar2; local_1c = local_1c + 1) {
    p_00 = p->vCis;
    iVar2 = Saig_ManPiNum(p);
    pvVar3 = Vec_PtrEntry(p_00,local_1c + iVar2);
    iVar2 = Saig_ManRegNum(p);
    if (local_1c < iVar2 / 2) {
      *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffef | 0x10;
    }
    else {
      *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf | 0x20;
    }
  }
  for (local_1c = 0; iVar2 = Vec_PtrSize(p->vObjs), local_1c < iVar2; local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_1c);
    if ((pObj_00 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pObj_00), iVar2 != 0)) {
      pAVar4 = Aig_ObjFanin0(pObj_00);
      uVar1 = *(ulong *)&pAVar4->field_0x18;
      pAVar4 = Aig_ObjFanin1(pObj_00);
      *(ulong *)&pObj_00->field_0x18 =
           *(ulong *)&pObj_00->field_0x18 & 0xffffffffffffffef |
           (ulong)((uint)(uVar1 >> 4) & 1 | (uint)(*(ulong *)&pAVar4->field_0x18 >> 4) & 1) << 4;
      pAVar4 = Aig_ObjFanin0(pObj_00);
      uVar1 = *(ulong *)&pAVar4->field_0x18;
      pAVar4 = Aig_ObjFanin1(pObj_00);
      *(ulong *)&pObj_00->field_0x18 =
           *(ulong *)&pObj_00->field_0x18 & 0xffffffffffffffdf |
           (ulong)((uint)(uVar1 >> 5) & 1 | (uint)(*(ulong *)&pAVar4->field_0x18 >> 5) & 1) << 5;
    }
  }
  return;
}

Assistant:

void Saig_ManDemiterMarkPos( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanMarkAB( p );
    Saig_ManForEachLo( p, pObj, i )
        if ( i < Saig_ManRegNum(p)/2 )
            pObj->fMarkA = 1;
        else
            pObj->fMarkB = 1;
    Aig_ManForEachNode( p, pObj, i )
    {
        pObj->fMarkA = Aig_ObjFanin0(pObj)->fMarkA | Aig_ObjFanin1(pObj)->fMarkA;
        pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB | Aig_ObjFanin1(pObj)->fMarkB;
    }
}